

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLSetTargetAttributeAndGetStatus
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,int value
              )

{
  int iVar1;
  XExtDisplayInfo *pXVar2;
  undefined1 local_60 [4];
  int success;
  xnvCtrlSetAttributeAndGetStatusReply rep;
  xnvCtrlSetAttributeAndGetStatusReq *req;
  XExtDisplayInfo *info;
  int value_local;
  uint attribute_local;
  uint display_mask_local;
  int target_id_local;
  int target_type_local;
  Display *dpy_local;
  
  pXVar2 = find_display(dpy);
  if ((pXVar2 == (XExtDisplayInfo *)0x0) || (pXVar2->codes == (XExtCodes *)0x0)) {
    dpy_local._4_4_ = 0;
  }
  else if ((pXVar2 == (XExtDisplayInfo *)0x0) || (pXVar2->codes == (XExtCodes *)0x0)) {
    XMissingExtension(dpy,nvctrl_extension_name);
    dpy_local._4_4_ = 0;
  }
  else {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    rep._24_8_ = _XGetRequest(dpy,0x13,0x14);
    *(char *)rep._24_8_ = (char)pXVar2->codes->major_opcode;
    *(undefined1 *)(rep._24_8_ + 1) = 0x13;
    *(short *)(rep._24_8_ + 6) = (short)target_type;
    *(short *)(rep._24_8_ + 4) = (short)target_id;
    *(uint *)(rep._24_8_ + 8) = display_mask;
    *(uint *)(rep._24_8_ + 0xc) = attribute;
    *(int *)(rep._24_8_ + 0x10) = value;
    iVar1 = _XReply(dpy,local_60,0);
    if (iVar1 == 0) {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
      }
      dpy_local._4_4_ = 0;
    }
    else {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
      }
      dpy_local._4_1_ = rep.type;
      dpy_local._5_1_ = rep.pad0;
      dpy_local._6_2_ = rep.sequenceNumber;
    }
  }
  return dpy_local._4_4_;
}

Assistant:

Bool XNVCTRLSetTargetAttributeAndGetStatus (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    int value
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetAttributeAndGetStatusReq *req;
    xnvCtrlSetAttributeAndGetStatusReply rep;
    Bool success;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    LockDisplay (dpy);
    GetReq (nvCtrlSetAttributeAndGetStatus, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetAttributeAndGetStatus;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->value = value;
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    UnlockDisplay (dpy);
    SyncHandle ();
    
    success = rep.flags;
    return success;
}